

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLink.cpp
# Opt level: O2

void __thiscall chrono::ChLink::ArchiveIN(ChLink *this,ChArchiveIn *marchive)

{
  ChNameValue<chrono::ChVector<double>_> local_48;
  ChNameValue<chrono::ChVector<double>_> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChLink>(marchive);
  ChLinkBase::ArchiveIN(&this->super_ChLinkBase,marchive);
  local_30._value = &this->react_force;
  local_30._name = "react_force";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->react_torque;
  local_48._name = "react_torque";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  return;
}

Assistant:

void ChLink::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLink>();

    // deserialize parent class
    ChLinkBase::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(react_force);
    marchive >> CHNVP(react_torque);
}